

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

int __thiscall QScrollBarPrivate::pixelPosToRangeValue(QScrollBarPrivate *this,int pos)

{
  undefined8 uVar1;
  long lVar2;
  QWidget *this_00;
  LayoutDirection LVar3;
  QStyle *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  QStyleOptionSlider *pQVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QStyleOptionSlider opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar6 = &DAT_00661ce0;
  pQVar7 = &opt;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *puVar6;
    (pQVar7->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar7->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar6 = puVar6 + 1;
    pQVar7 = (QStyleOptionSlider *)&(pQVar7->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&opt);
  pQVar4 = QWidget::style(this_00);
  auVar10 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,2,&opt,0x80,this_00);
  uVar8 = auVar10._0_8_;
  pQVar4 = QWidget::style(this_00);
  auVar11 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,2,&opt,0x40,this_00);
  if ((this->super_QAbstractSliderPrivate).orientation == Horizontal) {
    iVar9 = auVar10._8_4_ + auVar11._0_4_ + ~auVar11._8_4_;
    LVar3 = QWidget::layoutDirection(this_00);
    if (LVar3 == RightToLeft) {
      opt.upsideDown = (bool)(opt.upsideDown ^ 1);
    }
  }
  else {
    uVar8 = uVar8 >> 0x20;
    iVar9 = auVar10._12_4_ + auVar11._4_4_ + ~auVar11._12_4_;
  }
  iVar9 = QStyle::sliderValueFromPosition
                    (*(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254,
                     (this->super_QAbstractSliderPrivate).maximum,pos - (int)uVar8,
                     (iVar9 - (int)uVar8) + 1,opt.upsideDown);
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int QScrollBarPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarSlider, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
        if (q->layoutDirection() == Qt::RightToLeft)
            opt.upsideDown = !opt.upsideDown;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }

    return  QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                            sliderMax - sliderMin, opt.upsideDown);
}